

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

mz_bool mz_zip_reader_extract_to_callback
                  (mz_zip_archive *pZip,mz_uint file_index,mz_file_write_func pCallback,
                  void *pOpaque,mz_uint flags)

{
  void *pvVar1;
  mz_bool mVar2;
  tinfl_status tVar3;
  mz_zip_error mVar4;
  size_t sVar5;
  mz_uint8 *ptr;
  mz_uint8 *pOut_buf_start;
  size_t sVar6;
  undefined4 extraout_var;
  size_t sVar8;
  mz_ulong mVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  mz_uint8 *pOut_buf_next;
  mz_uint64 mVar13;
  ulong local_3010;
  mz_uint64 local_2ff8;
  ulong local_2fe0;
  size_t out_buf_size;
  size_t in_buf_size;
  size_t local_2fb8;
  undefined8 local_2fb0;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  tinfl_decompressor inflator;
  undefined8 uVar7;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  if (((pCallback == (mz_file_write_func)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0))
     || (pZip->m_pRead == (mz_file_read_func)0x0)) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  mVar2 = mz_zip_reader_file_stat(pZip,file_index,&file_stat);
  if (mVar2 == 0) {
    return 0;
  }
  if (file_stat.m_is_directory != 0) {
    return 1;
  }
  if (file_stat.m_comp_size == 0) {
    return 1;
  }
  if (((byte)file_stat.m_bit_flag & 0x61) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  if (((flags >> 10 & 1) == 0) && ((file_stat.m_method & 0xfff7) != 0)) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    return 0;
  }
  sVar5 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat.m_local_header_ofs,local_header_u32,0x1e);
  if (sVar5 != 0x1e) {
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
  if (local_header_u32[0] != 0x4034b50) {
LAB_002636ad:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  if (pZip->m_archive_size <
      file_stat.m_local_header_ofs + local_header_u32[6]._2_2_ + (ulong)(ushort)local_header_u32[7]
      + file_stat.m_comp_size + 0x1e) goto LAB_002636ad;
  local_2ff8 = file_stat.m_local_header_ofs + local_header_u32[6]._2_2_ +
               (ulong)(ushort)local_header_u32[7] + 0x1e;
  pvVar1 = pZip->m_pState->m_pMem;
  if (pvVar1 == (void *)0x0) {
    local_2fe0 = 0x10000;
    if (file_stat.m_comp_size < 0x10000) {
      local_2fe0 = file_stat.m_comp_size;
    }
    ptr = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_2fe0);
    if (ptr == (mz_uint8 *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
    mVar13 = 0;
    uVar10 = file_stat.m_comp_size;
  }
  else {
    ptr = (mz_uint8 *)((long)pvVar1 + local_2ff8);
    local_2fe0 = file_stat.m_comp_size;
    uVar10 = 0;
    mVar13 = file_stat.m_comp_size;
  }
  if (((flags >> 10 & 1) == 0) && (file_stat.m_method != 0)) {
    inflator.m_state = 0;
    pOut_buf_start = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x8000);
    if (pOut_buf_start == (mz_uint8 *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      pOut_buf_start = (mz_uint8 *)0x0;
      mVar2 = 0;
      goto LAB_00263ad2;
    }
    local_3010 = 0;
    lVar11 = 0;
    sVar5 = 0;
    do {
      uVar12 = (ulong)((uint)sVar5 & 0x7fff);
      out_buf_size = 0x8000 - uVar12;
      if (mVar13 == 0) {
        if (pZip->m_pState->m_pMem != (void *)0x0) {
          mVar13 = 0;
          goto LAB_0026380b;
        }
        mVar13 = uVar10;
        if (local_2fe0 < uVar10) {
          mVar13 = local_2fe0;
        }
        sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2ff8,ptr,mVar13);
        if (sVar6 == mVar13) {
          local_2ff8 = local_2ff8 + mVar13;
          uVar10 = uVar10 - mVar13;
          lVar11 = 0;
          goto LAB_0026380b;
        }
        mVar4 = MZ_ZIP_FILE_READ_FAILED;
LAB_00263a59:
        pZip->m_last_error = mVar4;
        mVar2 = 0;
        goto LAB_00263ad2;
      }
LAB_0026380b:
      pOut_buf_next = pOut_buf_start + uVar12;
      in_buf_size = mVar13;
      tVar3 = tinfl_decompress(&inflator,ptr + lVar11,&in_buf_size,pOut_buf_start,pOut_buf_next,
                               &out_buf_size,(uint)(uVar10 != 0) * 2);
      sVar6 = out_buf_size;
      uVar7 = CONCAT44(extraout_var,tVar3);
      sVar8 = in_buf_size;
      if (out_buf_size != 0) {
        local_2fb8 = in_buf_size;
        local_2fb0 = uVar7;
        sVar8 = (*pCallback)(pOpaque,sVar5,pOut_buf_next,out_buf_size);
        if (sVar8 == sVar6) {
          local_3010 = mz_crc32(local_3010 & 0xffffffff,pOut_buf_next,sVar6);
          sVar5 = sVar5 + sVar6;
          uVar7 = local_2fb0;
          sVar8 = local_2fb8;
          if (sVar5 <= file_stat.m_uncomp_size) goto LAB_002638f4;
          mVar4 = MZ_ZIP_DECOMPRESSION_FAILED;
        }
        else {
          mVar4 = MZ_ZIP_WRITE_CALLBACK_FAILED;
        }
        goto LAB_00263a59;
      }
LAB_002638f4:
      mVar13 = mVar13 - sVar8;
      lVar11 = lVar11 + sVar8;
    } while ((int)uVar7 - 1U < 2);
    mVar2 = 0;
    if ((int)uVar7 != 0) goto LAB_00263ad2;
LAB_00263a72:
    if ((flags >> 10 & 1) != 0) {
      mVar2 = 1;
      goto LAB_00263ad2;
    }
  }
  else {
    if (pZip->m_pState->m_pMem == (void *)0x0) {
      local_3010 = 0;
      sVar5 = 0;
      for (; uVar10 != 0; uVar10 = uVar10 - uVar12) {
        uVar12 = uVar10;
        if (local_2fe0 < uVar10) {
          uVar12 = local_2fe0;
        }
        sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2ff8,ptr,uVar12);
        if (sVar6 != uVar12) {
          pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
LAB_00263ab2:
          pOut_buf_start = (mz_uint8 *)0x0;
          mVar2 = 0;
          goto LAB_00263ad2;
        }
        if ((flags >> 10 & 1) == 0) {
          local_3010 = mz_crc32(local_3010 & 0xffffffff,ptr,uVar12);
        }
        sVar6 = (*pCallback)(pOpaque,sVar5,ptr,uVar12);
        if (sVar6 != uVar12) {
          pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
          goto LAB_00263ab2;
        }
        local_2ff8 = local_2ff8 + uVar12;
        sVar5 = sVar5 + uVar12;
      }
      pOut_buf_start = (mz_uint8 *)0x0;
      goto LAB_00263a72;
    }
    mVar2 = 0;
    sVar5 = (*pCallback)(pOpaque,0,ptr,file_stat.m_comp_size);
    if (sVar5 != file_stat.m_comp_size) {
      pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
LAB_00263a65:
      pOut_buf_start = (mz_uint8 *)0x0;
      goto LAB_00263ad2;
    }
    if ((flags >> 10 & 1) != 0) {
      mVar2 = 1;
      goto LAB_00263a65;
    }
    pOut_buf_start = (mz_uint8 *)0x0;
    mVar9 = mz_crc32(0,ptr,sVar5);
    local_3010._0_4_ = (mz_uint32)mVar9;
  }
  if (sVar5 == file_stat.m_uncomp_size) {
    if ((mz_uint32)local_3010 == file_stat.m_crc32) {
      mVar2 = 1;
      goto LAB_00263ad2;
    }
    pZip->m_last_error = MZ_ZIP_DECOMPRESSION_FAILED;
  }
  else {
    pZip->m_last_error = MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE;
  }
  mVar2 = 0;
LAB_00263ad2:
  if (pZip->m_pState->m_pMem == (void *)0x0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
  }
  if (pOut_buf_start != (mz_uint8 *)0x0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pOut_buf_start);
    return mVar2;
  }
  return mVar2;
}

Assistant:

mz_bool mz_zip_reader_extract_to_callback(mz_zip_archive *pZip, mz_uint file_index, mz_file_write_func pCallback, void *pOpaque, mz_uint flags)
{
    int status = TINFL_STATUS_DONE;
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
    mz_uint file_crc32 = MZ_CRC32_INIT;
#endif
    mz_uint64 read_buf_size, read_buf_ofs = 0, read_buf_avail, comp_remaining, out_buf_ofs = 0, cur_file_ofs;
    mz_zip_archive_file_stat file_stat;
    void *pRead_buf = NULL;
    void *pWrite_buf = NULL;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;

    if ((!pZip) || (!pZip->m_pState) || (!pCallback) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
        return MZ_FALSE;

    /* A directory or zero length file */
    if ((file_stat.m_is_directory) || (!file_stat.m_comp_size))
        return MZ_TRUE;

    /* Encryption and patch files are not supported. */
    if (file_stat.m_bit_flag & (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

    /* This function only supports decompressing stored and deflate. */
    if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

    /* Read and do some minimal validation of the local directory entry (this doesn't crack the zip64 stuff, which we already have from the central dir) */
    cur_file_ofs = file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    /* Decompress the file either directly from memory or from a file input buffer. */
    if (pZip->m_pState->m_pMem)
    {
        pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
        read_buf_size = read_buf_avail = file_stat.m_comp_size;
        comp_remaining = 0;
    }
    else
    {
        read_buf_size = MZ_MIN(file_stat.m_comp_size, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
        if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)read_buf_size)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        read_buf_avail = 0;
        comp_remaining = file_stat.m_comp_size;
    }

    if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method))
    {
        /* The file is stored or the caller has requested the compressed data. */
        if (pZip->m_pState->m_pMem)
        {
            if (((sizeof(size_t) == sizeof(mz_uint32))) && (file_stat.m_comp_size > MZ_UINT32_MAX))
                return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

            if (pCallback(pOpaque, out_buf_ofs, pRead_buf, (size_t)file_stat.m_comp_size) != file_stat.m_comp_size)
            {
                mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
                status = TINFL_STATUS_FAILED;
            }
            else if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
            {
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                file_crc32 = (mz_uint32)mz_crc32(file_crc32, (const mz_uint8 *)pRead_buf, (size_t)file_stat.m_comp_size);
#endif
            }

            cur_file_ofs += file_stat.m_comp_size;
            out_buf_ofs += file_stat.m_comp_size;
            comp_remaining = 0;
        }
        else
        {
            while (comp_remaining)
            {
                read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
                if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                    status = TINFL_STATUS_FAILED;
                    break;
                }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
                {
                    file_crc32 = (mz_uint32)mz_crc32(file_crc32, (const mz_uint8 *)pRead_buf, (size_t)read_buf_avail);
                }
#endif

                if (pCallback(pOpaque, out_buf_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
                    status = TINFL_STATUS_FAILED;
                    break;
                }

                cur_file_ofs += read_buf_avail;
                out_buf_ofs += read_buf_avail;
                comp_remaining -= read_buf_avail;
            }
        }
    }
    else
    {
        tinfl_decompressor inflator;
        tinfl_init(&inflator);

        if (NULL == (pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, TINFL_LZ_DICT_SIZE)))
        {
            mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            status = TINFL_STATUS_FAILED;
        }
        else
        {
            do
            {
                mz_uint8 *pWrite_buf_cur = (mz_uint8 *)pWrite_buf + (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
                size_t in_buf_size, out_buf_size = TINFL_LZ_DICT_SIZE - (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
                if ((!read_buf_avail) && (!pZip->m_pState->m_pMem))
                {
                    read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
                    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail)
                    {
                        mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                        status = TINFL_STATUS_FAILED;
                        break;
                    }
                    cur_file_ofs += read_buf_avail;
                    comp_remaining -= read_buf_avail;
                    read_buf_ofs = 0;
                }

                in_buf_size = (size_t)read_buf_avail;
                status = tinfl_decompress(&inflator, (const mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size, (mz_uint8 *)pWrite_buf, pWrite_buf_cur, &out_buf_size, comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
                read_buf_avail -= in_buf_size;
                read_buf_ofs += in_buf_size;

                if (out_buf_size)
                {
                    if (pCallback(pOpaque, out_buf_ofs, pWrite_buf_cur, out_buf_size) != out_buf_size)
                    {
                        mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
                        status = TINFL_STATUS_FAILED;
                        break;
                    }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                    file_crc32 = (mz_uint32)mz_crc32(file_crc32, pWrite_buf_cur, out_buf_size);
#endif
                    if ((out_buf_ofs += out_buf_size) > file_stat.m_uncomp_size)
                    {
                        mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
                        status = TINFL_STATUS_FAILED;
                        break;
                    }
                }
            } while ((status == TINFL_STATUS_NEEDS_MORE_INPUT) || (status == TINFL_STATUS_HAS_MORE_OUTPUT));
        }
    }

    if ((status == TINFL_STATUS_DONE) && (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
    {
        /* Make sure the entire file was decompressed, and check its CRC. */
        if (out_buf_ofs != file_stat.m_uncomp_size)
        {
            mz_zip_set_error(pZip, MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE);
            status = TINFL_STATUS_FAILED;
        }
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        else if (file_crc32 != file_stat.m_crc32)
        {
            mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
            status = TINFL_STATUS_FAILED;
        }
#endif
    }

    if (!pZip->m_pState->m_pMem)
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

    if (pWrite_buf)
        pZip->m_pFree(pZip->m_pAlloc_opaque, pWrite_buf);

    return status == TINFL_STATUS_DONE;
}